

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 normalizeRoundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,float_status *status)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  ulong zSig0_00;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint64_t zSig2;
  ulong zSig1_00;
  float128 fVar7;
  
  uVar4 = zSig1;
  zSig0_00 = zSig0;
  if (zSig0 == 0) {
    uVar4 = 0;
    zSig0_00 = zSig1;
  }
  if (zSig0_00 == 0) {
    uVar5 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (zSig0_00 != 0) {
      for (; zSig0_00 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = (uint)lVar1 ^ 0x3f;
  }
  iVar6 = uVar5 * 0x1000000 + -0xf000000;
  bVar2 = (byte)((uint)iVar6 >> 0x18);
  if (iVar6 >> 0x18 < 0) {
    zSig2 = uVar4 << (bVar2 & 0x3f);
    zSig1_00 = uVar4 >> (-bVar2 & 0x3f) | zSig0_00 << (bVar2 & 0x3f);
    zSig0_00 = zSig0_00 >> (-bVar2 & 0x3f);
  }
  else {
    zSig1_00 = uVar4 << (bVar2 & 0x3f);
    if (iVar6 != 0) {
      zSig0_00 = zSig0_00 << (bVar2 & 0x3f) | uVar4 >> (-bVar2 & 0x3f);
    }
    zSig2 = 0;
  }
  iVar3 = zExp + -0x40;
  if (zSig0 != 0) {
    iVar3 = zExp;
  }
  fVar7 = roundAndPackFloat128(zSign,iVar3 - (iVar6 >> 0x18),zSig0_00,zSig1_00,zSig2,status);
  return fVar7;
}

Assistant:

static float128 normalizeRoundAndPackFloat128(flag zSign, int32_t zExp,
                                              uint64_t zSig0, uint64_t zSig1,
                                              float_status *status)
{
    int8_t shiftCount;
    uint64_t zSig2;

    if ( zSig0 == 0 ) {
        zSig0 = zSig1;
        zSig1 = 0;
        zExp -= 64;
    }
    shiftCount = clz64(zSig0) - 15;
    if ( 0 <= shiftCount ) {
        zSig2 = 0;
        shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    }
    else {
        shift128ExtraRightJamming(
            zSig0, zSig1, 0, - shiftCount, &zSig0, &zSig1, &zSig2 );
    }
    zExp -= shiftCount;
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}